

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casts.h
# Opt level: O3

void __thiscall
CoreML::Specification::CoreMLModels::TextClassifier::CheckTypeAndMergeFrom
          (TextClassifier *this,MessageLite *from)

{
  ulong uVar1;
  LogMessage *other;
  StringVector *this_00;
  undefined8 *puVar2;
  ulong uVar3;
  undefined1 *from_00;
  Arena *arena;
  LogFinisher LStack_51;
  LogMessage LStack_50;
  
  if (from->_vptr_MessageLite != (_func_int **)&PTR__TextClassifier_0048f500) {
    __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/casts.h"
                  ,0x5e,
                  "To google::protobuf::internal::down_cast(From *) [To = const CoreML::Specification::CoreMLModels::TextClassifier *, From = const google::protobuf::MessageLite]"
                 );
  }
  if ((TextClassifier *)from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&LStack_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/TextClassifier.pb.cc"
               ,0x15f);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&LStack_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&LStack_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&LStack_50);
  }
  uVar3 = (ulong)from[1]._vptr_MessageLite & 0xfffffffffffffffe;
  if (*(long *)(uVar3 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->language_,uVar3,puVar2);
  }
  uVar3 = from[1]._internal_metadata_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar3 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->modelparameterdata_,uVar3,puVar2);
  }
  if (*(uint32_t *)&from[2]._vptr_MessageLite != 0) {
    this->revision_ = *(uint32_t *)&from[2]._vptr_MessageLite;
  }
  if (*(int *)((long)&from[3]._vptr_MessageLite + 4) != 200) goto LAB_002c9d78;
  if (this->_oneof_case_[0] == 200) {
    this_00 = (this->ClassLabels_).stringclasslabels_;
LAB_002c9d66:
    from_00 = (undefined1 *)from[2]._internal_metadata_.ptr_;
  }
  else {
    clear_ClassLabels(this);
    this->_oneof_case_[0] = 200;
    uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    this_00 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringVector>
                        (arena);
    (this->ClassLabels_).stringclasslabels_ = this_00;
    if (*(int *)((long)&from[3]._vptr_MessageLite + 4) == 200) goto LAB_002c9d66;
    from_00 = _StringVector_default_instance_;
  }
  StringVector::MergeFrom(this_00,(StringVector *)from_00);
LAB_002c9d78:
  uVar3 = (from->_internal_metadata_).ptr_;
  if ((uVar3 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar3 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

inline To down_cast(From* f) {                   // so we only accept pointers
  // Ensures that To is a sub-type of From *.  This test is here only
  // for compile-time type checking, and has no overhead in an
  // optimized build at run-time, as it will be optimized away
  // completely.
  if (false) {
    implicit_cast<From*, To>(0);
  }

#if !defined(NDEBUG) && PROTOBUF_RTTI
  assert(f == nullptr || dynamic_cast<To>(f) != nullptr);  // RTTI: debug mode only!
#endif
  return static_cast<To>(f);
}